

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

cf_bool_t cf_lite_queue_push_front(cf_lite_queue_t *self,void *data)

{
  cf_bool_t cVar1;
  cf_size_t cVar2;
  ulong uVar3;
  
  cVar1 = 0;
  if (data != (void *)0x0) {
    cVar2 = self->count;
    if (cVar2 == self->capacity) {
      cVar1 = cf_lite_queue_extend(self);
      if (cVar1 == 0) {
        return 0;
      }
      cVar2 = self->count;
    }
    if (cVar2 == 0) {
      self->head = 0;
      self->tail = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = (((ulong)self->head + self->capacity) - 1) % self->capacity;
      self->head = (cf_uint_t)uVar3;
      uVar3 = uVar3 & 0xffffffff;
    }
    cVar2 = self->elm_size;
    cf_memcpy_s((cf_void_t *)(uVar3 * cVar2 + (long)self->items),cVar2,data,cVar2);
    self->count = self->count + 1;
    cVar1 = 1;
  }
  return cVar1;
}

Assistant:

cf_bool_t cf_lite_queue_push_front(cf_lite_queue_t* self, void* data) {
    if (!data) {
        return CF_FALSE;
    }

    if (self->count == self->capacity) {
        if (!cf_lite_queue_extend(self)) {
            return CF_FALSE;
        }
    }

    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->head = (self->capacity + self->head - 1) % self->capacity;
    }
    cf_memcpy_s((void*)&((((cf_uint8_t*)(self->items))[self->elm_size * self->head])), \
        self->elm_size, data, self->elm_size);
    self->count++;
    return CF_TRUE;
}